

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O2

void __thiscall deci::stack_t::stack_t(stack_t *this)

{
  value_t *pvVar1;
  
  (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dictionary_t::dictionary_t(&this->context);
  pvVar1 = nothing_t::Instance();
  this->result = pvVar1;
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::reserve(&this->storage,8);
  return;
}

Assistant:

stack_t::stack_t()
    : storage()
    , context()
    , result(&nothing_t::Instance()) 
  {
    storage.reserve(8);
  }